

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_branch(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  target_ulong_conflict tVar1;
  TCGContext_conflict2 *tcg_ctx_00;
  uint16_t uVar2;
  uint uVar3;
  TCGv_i32 val;
  TCGLabel *l1_00;
  TCGLabel *l1;
  int op;
  uint32_t base;
  int32_t offset;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  tVar1 = s->pc;
  uVar3 = (int)(uint)insn >> 8 & 0xf;
  op = (int)(char)insn;
  if (op == 0) {
    uVar2 = read_im16(env,s);
    op = (int)(short)uVar2;
  }
  else if (op == -1) {
    op = read_im32(env,s);
  }
  if (uVar3 == 1) {
    val = tcg_const_i32_m68k(tcg_ctx_00,s->pc);
    gen_push(s,val);
  }
  if (uVar3 < 2) {
    update_cc_op(s);
    gen_jmp_tb(s,0,tVar1 + op);
  }
  else {
    l1_00 = gen_new_label_m68k(tcg_ctx_00);
    gen_jmpcc(s,(int)(uint)insn >> 8 & 0xfU ^ 1,l1_00);
    gen_jmp_tb(s,1,tVar1 + op);
    gen_set_label(tcg_ctx_00,l1_00);
    gen_jmp_tb(s,0,s->pc);
  }
  return;
}

Assistant:

DISAS_INSN(branch)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int32_t offset;
    uint32_t base;
    int op;

    base = s->pc;
    op = (insn >> 8) & 0xf;
    offset = (int8_t)insn;
    if (offset == 0) {
        offset = (int16_t)read_im16(env, s);
    } else if (offset == -1) {
        offset = read_im32(env, s);
    }
    if (op == 1) {
        /* bsr */
        gen_push(s, tcg_const_i32(tcg_ctx, s->pc));
    }
    if (op > 1) {
        /* Bcc */
        TCGLabel *l1 = gen_new_label(tcg_ctx);
        gen_jmpcc(s, ((insn >> 8) & 0xf) ^ 1, l1);
        gen_jmp_tb(s, 1, base + offset);
        gen_set_label(tcg_ctx, l1);
        gen_jmp_tb(s, 0, s->pc);
    } else {
        /* Unconditional branch.  */
        update_cc_op(s);
        gen_jmp_tb(s, 0, base + offset);
    }
}